

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

bool __thiscall
LZ77Compressor::search
          (LZ77Compressor *this,uint8_t *bytes,int srcOffset,int maxLen,int *matchOff,int *matchLen)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  
  uVar5 = (ulong)bytes[(long)srcOffset + 2] << 2 ^
          (ulong)((uint)bytes[(long)srcOffset + 1] * 2) ^ (ulong)bytes[srcOffset];
  *matchOff = -1;
  *matchLen = 2;
  piVar6 = this->dict[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = this->dict[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar6 == piVar2) {
    return false;
  }
  iVar3 = 2;
  do {
    iVar1 = *piVar6;
    if (srcOffset < iVar1 + maxLen) {
      if (maxLen < 1) goto LAB_001099b3;
      uVar5 = 0;
      iVar4 = iVar1;
      do {
        if (srcOffset <= iVar4) {
          iVar4 = iVar1;
        }
        if (bytes[iVar4] != bytes[uVar5 + (long)srcOffset]) goto LAB_001099b6;
        uVar5 = uVar5 + 1;
        iVar4 = iVar4 + 1;
      } while ((uint)maxLen != uVar5);
LAB_001099ae:
      uVar5 = (ulong)(uint)maxLen;
    }
    else {
      if (0 < maxLen) {
        uVar5 = 0;
        do {
          if (bytes[uVar5 + (long)iVar1] != bytes[uVar5 + (long)srcOffset]) goto LAB_001099b6;
          uVar5 = uVar5 + 1;
        } while ((uint)maxLen != uVar5);
        goto LAB_001099ae;
      }
LAB_001099b3:
      uVar5 = 0;
    }
LAB_001099b6:
    iVar4 = (int)uVar5;
    if (iVar3 < iVar4) {
      *matchOff = iVar1;
      *matchLen = iVar4;
      iVar3 = iVar4;
      if (iVar4 == maxLen) break;
    }
    piVar6 = piVar6 + 1;
  } while (piVar6 != piVar2);
  return 2 < iVar3;
}

Assistant:

bool search(const uint8_t* bytes, int srcOffset, int maxLen, int& matchOff, int& matchLen) {
		auto& v = dict[hash(bytes + srcOffset)];

		matchOff = -1;
		matchLen = 2;

		for (int off : v) {
			int i = 0;
			if (off + maxLen > srcOffset) {
				// Unlikely, will wrap
				for (int off2 = off; i < maxLen; i++, off2++) {
					if (off2 >= srcOffset) {
						off2 = off;
					}
					if (bytes[off2] != bytes[srcOffset + i]) { break; }
				}
			} else {
				for (; i < maxLen; i++) {
					if (bytes[off + i] != bytes[srcOffset + i]) { break; }
				}
			}
			if (i > matchLen) {
				matchOff = off;
				matchLen = i;
				if (matchLen == maxLen) { break; }
			}
		}

		return matchLen > 2;
	}